

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarimage.hpp
# Opt level: O0

vec2f __thiscall ScalarImage::dfduv(ScalarImage *this,vec2f *uv)

{
  int y_00;
  int x_00;
  float *in_RSI;
  ScalarImage *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float dfdv;
  float dfdu;
  float dfdy2;
  float dfdy1;
  float dfdx2;
  float dfdx1;
  float yr;
  float xr;
  int y;
  int x;
  vec2f local_8;
  
  x_00 = (int)(*in_RSI * (float)in_RDI->w);
  y_00 = (int)(in_RSI[1] * (float)in_RDI->h);
  if ((((*in_RSI <= 0.0 && *in_RSI != 0.0) || (in_RSI[1] <= 0.0 && in_RSI[1] != 0.0)) ||
      (in_RDI->w <= x_00 + 2)) || (in_RDI->h <= y_00 + 2)) {
    vec2f::vec2f(&local_8);
  }
  else {
    fVar1 = *in_RSI * (float)in_RDI->w + -(float)x_00;
    fVar2 = in_RSI[1] * (float)in_RDI->h + -(float)y_00;
    fVar3 = getPixel(in_RDI,x_00 + 1,y_00);
    fVar4 = getPixel(in_RDI,x_00,y_00);
    fVar5 = getPixel(in_RDI,x_00 + 1,y_00 + 1);
    fVar6 = getPixel(in_RDI,x_00,y_00 + 1);
    fVar7 = getPixel(in_RDI,x_00,y_00 + 1);
    fVar8 = getPixel(in_RDI,x_00,y_00);
    fVar9 = getPixel(in_RDI,x_00 + 1,y_00 + 1);
    fVar10 = getPixel(in_RDI,x_00 + 1,y_00);
    vec2f::vec2f(&local_8,(fVar1 * (fVar5 - fVar6) + (1.0 - fVar1) * (fVar3 - fVar4)) * 2.0,
                 (fVar2 * (fVar9 - fVar10) + (1.0 - fVar2) * (fVar7 - fVar8)) * 2.0);
  }
  return local_8;
}

Assistant:

vec2f dfduv(const vec2f& uv) {
		int x = int(uv.x*w);
		int y = int(uv.y*h);
		if (uv.x<0 || uv.y<0 || x+2>=w || y+2>=h) return vec2f();
		float xr = uv.x*w-x;
		float yr = uv.y*h-y;
		float dfdx1 = getPixel(x+1,y) - getPixel(x,y);
		float dfdx2 = getPixel(x+1,y+1) - getPixel(x,y+1);
		float dfdy1 = getPixel(x,y+1) - getPixel(x,y);
		float dfdy2 = getPixel(x+1,y+1) - getPixel(x+1,y);
		float dfdu = (xr*dfdx2 + (1-xr)*dfdx1) * 2;
		float dfdv = (yr*dfdy2 + (1-yr)*dfdy1) * 2; // just a random scaling
		return vec2f(dfdu, dfdv);
	}